

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptionsImpl<google::protobuf::MethodDescriptor>
          (DescriptorBuilder *this,string *name_scope,string *element_name,OptionsType *orig_options
          ,MethodDescriptor *descriptor,vector<int,_std::allocator<int>_> *options_path,
          string *option_name)

{
  Tables *this_00;
  DescriptorPool *this_01;
  MethodOptions *this_02;
  bool bVar1;
  int iVar2;
  Type TVar3;
  int iVar4;
  Descriptor *extendee;
  UnknownField *this_03;
  FileDescriptor *local_158;
  FieldDescriptor *local_150;
  FieldDescriptor *field;
  undefined1 auStack_140 [4];
  int i;
  Symbol local_130;
  Symbol msg_symbol;
  UnknownFieldSet *unknown_fields;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  MethodOptions *local_48;
  OptionsType *options;
  OptionsType *dummy;
  vector<int,_std::allocator<int>_> *options_path_local;
  MethodDescriptor *descriptor_local;
  OptionsType *orig_options_local;
  string *element_name_local;
  string *name_scope_local;
  DescriptorBuilder *this_local;
  
  options = (OptionsType *)0x0;
  dummy = (OptionsType *)options_path;
  options_path_local = (vector<int,_std::allocator<int>_> *)descriptor;
  descriptor_local = (MethodDescriptor *)orig_options;
  orig_options_local = (OptionsType *)element_name;
  element_name_local = name_scope;
  name_scope_local = (string *)this;
  local_48 = DescriptorPool::Tables::AllocateMessage<google::protobuf::MethodOptions>
                       (this->tables_,(MethodOptions *)0x0);
  bVar1 = MethodOptions::IsInitialized((MethodOptions *)descriptor_local);
  this_02 = local_48;
  if (bVar1) {
    MessageLite::SerializeAsString_abi_cxx11_(&local_b8,(MessageLite *)descriptor_local);
    MessageLite::ParseFromString((MessageLite *)this_02,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    options_path_local[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_48;
    iVar2 = MethodOptions::uninterpreted_option_size(local_48);
    if (0 < iVar2) {
      anon_unknown_1::OptionsToInterpret::OptionsToInterpret
                ((OptionsToInterpret *)&unknown_fields,element_name_local,
                 (string *)orig_options_local,(vector<int,_std::allocator<int>_> *)dummy,
                 (Message *)descriptor_local,&local_48->super_Message);
      std::
      vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ::push_back(&this->options_to_interpret_,(OptionsToInterpret *)&unknown_fields);
      anon_unknown_1::OptionsToInterpret::~OptionsToInterpret((OptionsToInterpret *)&unknown_fields)
      ;
    }
    msg_symbol.ptr_ = (SymbolBase *)MethodOptions::unknown_fields((MethodOptions *)descriptor_local)
    ;
    bVar1 = UnknownFieldSet::empty((UnknownFieldSet *)msg_symbol.ptr_);
    if (!bVar1) {
      this_00 = this->tables_;
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                ((StringPiece *)auStack_140,option_name);
      local_130 = DescriptorPool::Tables::FindSymbol(this_00,_auStack_140);
      TVar3 = Symbol::type(&local_130);
      if (TVar3 == MESSAGE) {
        for (field._4_4_ = 0; iVar2 = field._4_4_,
            iVar4 = UnknownFieldSet::field_count((UnknownFieldSet *)msg_symbol.ptr_), iVar2 < iVar4;
            field._4_4_ = field._4_4_ + 1) {
          assert_mutex_held(this->pool_);
          this_01 = this->pool_;
          extendee = Symbol::descriptor(&local_130);
          this_03 = UnknownFieldSet::field((UnknownFieldSet *)msg_symbol.ptr_,field._4_4_);
          iVar2 = UnknownField::number(this_03);
          local_150 = DescriptorPool::InternalFindExtensionByNumberNoLock(this_01,extendee,iVar2);
          if (local_150 != (FieldDescriptor *)0x0) {
            local_158 = FieldDescriptor::file(local_150);
            std::
            set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::erase(&this->unused_dependency_,&local_158);
          }
        }
      }
    }
  }
  else {
    std::operator+(&local_88,element_name_local,".");
    std::operator+(&local_68,&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   orig_options_local);
    AddError(this,&local_68,(Message *)descriptor_local,OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptionsImpl(
    const std::string& name_scope, const std::string& element_name,
    const typename DescriptorT::OptionsType& orig_options,
    DescriptorT* descriptor, const std::vector<int>& options_path,
    const std::string& option_name) {
  // We need to use a dummy pointer to work around a bug in older versions of
  // GCC.  Otherwise, the following two lines could be replaced with:
  //   typename DescriptorT::OptionsType* options =
  //       tables_->AllocateMessage<typename DescriptorT::OptionsType>();
  typename DescriptorT::OptionsType* const dummy = nullptr;
  typename DescriptorT::OptionsType* options = tables_->AllocateMessage(dummy);

  if (!orig_options.IsInitialized()) {
    AddError(name_scope + "." + element_name, orig_options,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    return;
  }

  // Avoid using MergeFrom()/CopyFrom() in this class to make it -fno-rtti
  // friendly. Without RTTI, MergeFrom() and CopyFrom() will fallback to the
  // reflection based method, which requires the Descriptor. However, we are in
  // the middle of building the descriptors, thus the deadlock.
  options->ParseFromString(orig_options.SerializeAsString());
  descriptor->options_ = options;

  // Don't add to options_to_interpret_ unless there were uninterpreted
  // options.  This not only avoids unnecessary work, but prevents a
  // bootstrapping problem when building descriptors for descriptor.proto.
  // descriptor.proto does not contain any uninterpreted options, but
  // attempting to interpret options anyway will cause
  // OptionsType::GetDescriptor() to be called which may then deadlock since
  // we're still trying to build it.
  if (options->uninterpreted_option_size() > 0) {
    options_to_interpret_.push_back(OptionsToInterpret(
        name_scope, element_name, options_path, &orig_options, options));
  }

  // If the custom option is in unknown fields, no need to interpret it.
  // Remove the dependency file from unused_dependency.
  const UnknownFieldSet& unknown_fields = orig_options.unknown_fields();
  if (!unknown_fields.empty()) {
    // Can not use options->GetDescriptor() which may case deadlock.
    Symbol msg_symbol = tables_->FindSymbol(option_name);
    if (msg_symbol.type() == Symbol::MESSAGE) {
      for (int i = 0; i < unknown_fields.field_count(); ++i) {
        assert_mutex_held(pool_);
        const FieldDescriptor* field =
            pool_->InternalFindExtensionByNumberNoLock(
                msg_symbol.descriptor(), unknown_fields.field(i).number());
        if (field) {
          unused_dependency_.erase(field->file());
        }
      }
    }
  }
}